

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createLightSource_point(SemanticParser *this,SP *in)

{
  bool bVar1;
  undefined1 uVar2;
  element_type *peVar3;
  iterator this_00;
  iterator result;
  element_type *peVar4;
  runtime_error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  SP SVar5;
  vec3f vVar6;
  size_t N;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  affine3f transform;
  SP light;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffe48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  vec3f *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe78 [16];
  ParamSet *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  string local_120 [32];
  undefined8 local_100;
  undefined4 local_f4;
  undefined8 local_f0;
  float local_e8;
  float local_dc;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  float *in_stack_ffffffffffffff30;
  ParamSet *in_stack_ffffffffffffff38;
  string local_a0 [32];
  string *in_stack_ffffffffffffff80;
  size_t *in_stack_ffffffffffffff88;
  undefined1 local_58 [88];
  
  std::make_shared<pbrt::PointLightSource>();
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1c1ad8);
  memcpy(local_58,&peVar3->transform,0x30);
  std::__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1c1afb);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
            ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                     *)in_stack_fffffffffffffe48);
  result = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                  *)in_stack_fffffffffffffe48);
  do {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff98,(_Self *)&stack0xffffffffffffff90);
    if (!bVar1) {
      std::shared_ptr<pbrt::LightSource>::shared_ptr<pbrt::PointLightSource,void>
                ((shared_ptr<pbrt::LightSource> *)in_stack_fffffffffffffe50,
                 (shared_ptr<pbrt::PointLightSource> *)in_stack_fffffffffffffe48);
      local_f4 = 1;
      std::shared_ptr<pbrt::PointLightSource>::~shared_ptr
                ((shared_ptr<pbrt::PointLightSource> *)0x1c1fe6);
      SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (SP)SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x1c1b5c);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff30,local_a0);
    uVar2 = std::operator==(&in_stack_fffffffffffffe50->first,(char *)in_stack_fffffffffffffe48);
    if ((bool)uVar2) {
      peVar3 = std::
               __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1c1bb6);
      in_stack_fffffffffffffe90 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(peVar3->super_Node).super_ParamSet;
      std::__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1c1bcc);
      syntactic::ParamSet::getParam3f
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1c1bf4);
      vVar6 = math::xfmPoint((affine3f *)
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe74 = vVar6.z;
      local_f0 = vVar6._0_8_;
      in_stack_fffffffffffffe78._8_4_ = extraout_XMM0_Dc;
      in_stack_fffffffffffffe78._0_8_ = local_f0;
      in_stack_fffffffffffffe78._12_4_ = extraout_XMM0_Dd;
      local_dc = vVar6.x;
      in_stack_ffffffffffffff28 = vVar6.y;
      local_e8 = in_stack_fffffffffffffe74;
      in_stack_ffffffffffffff2c = in_stack_fffffffffffffe74;
      peVar4 = std::
               __shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1c1c5d);
      (peVar4->from).x = local_dc;
      (peVar4->from).y = in_stack_ffffffffffffff28;
      (peVar4->from).z = in_stack_ffffffffffffff2c;
    }
    else {
      bVar1 = std::operator==(&in_stack_fffffffffffffe50->first,(char *)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe70 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe70);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1c1cfc);
        in_stack_fffffffffffffe68 = (vec3f *)&(peVar3->super_Node).super_ParamSet;
        std::__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c1d12);
        syntactic::ParamSet::getParam3f
                  (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                   (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffffe50->first,(char *)in_stack_fffffffffffffe48)
        ;
        if (!bVar1) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((char *)CONCAT17(uVar2,in_stack_fffffffffffffe98),in_stack_fffffffffffffe90
                        );
          std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
          std::runtime_error::runtime_error(this_01,local_120);
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1c1d6e);
        bVar1 = syntactic::ParamSet::hasParam3f
                          (in_stack_fffffffffffffe88,in_stack_fffffffffffffe78._8_8_);
        if (bVar1) {
          peVar3 = std::
                   __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1c1d9c);
          in_stack_fffffffffffffe58 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(peVar3->super_Node).super_ParamSet;
          std::__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c1db2);
          syntactic::ParamSet::getParam3f
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                     (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        }
        else {
          local_100 = 0;
          std::
          __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c1de8);
          syntactic::ParamSet::getParamPairNf
                    ((ParamSet *)this_00._M_node,(value_type *)result._M_node,
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          std::__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c1e17);
          std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::resize
                    ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     (size_type)in_stack_fffffffffffffe68);
          peVar3 = std::
                   __shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1c1e37);
          in_stack_fffffffffffffe50 =
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)&(peVar3->super_Node).super_ParamSet;
          std::__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::PointLightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c1e4d);
          std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::data
                    ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                     0x1c1e59);
          syntactic::ParamSet::getParamPairNf
                    ((ParamSet *)this_00._M_node,(value_type *)result._M_node,
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        }
      }
    }
    local_f4 = 3;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(in_stack_fffffffffffffe50);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)in_stack_fffffffffffffe50);
  } while( true );
}

Assistant:

LightSource::SP SemanticParser::createLightSource_point
  (pbrt::syntactic::LightSource::SP in)
  {
    PointLightSource::SP light = std::make_shared<PointLightSource>();
    affine3f transform = in->transform.atStart;
    for (auto it : in->param) {
      const std::string name = it.first;
      if (name == "from") {
        in->getParam3f(&light->from.x,name);
        light->from = xfmPoint(transform,light->from);
        continue;
      }
      if (name == "scale") {
        in->getParam3f(&light->scale.x,name);
        continue;
      }
      if (name == "I") {
        if (in->hasParam3f(name)) 
          in->getParam3f(&light->I.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          light->Ispectrum.spd.resize(N);
          in->getParamPairNf(light->Ispectrum.spd.data(),&N,name);
        }
        continue;
      }
      throw std::runtime_error("unknown 'point' light source param '"+name+"'");
    }
    
    return light;
  }